

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

void ptls_log__recalc_conn
               (int caller_locked,st_ptls_log_conn_state_t *conn,_func_char_ptr_void_ptr *get_sni,
               void *get_sni_arg)

{
  float fVar1;
  in6_addr iVar2;
  anon_union_16_3_a3f0114d_for___in6_u *paVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int iVar6;
  char *search_for;
  anon_union_16_3_a3f0114d_for___in6_u *paVar7;
  size_t slot;
  long lVar8;
  uint uVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  uint8_t local_48;
  uint8_t uStack_47;
  uint8_t uStack_46;
  uint8_t uStack_45;
  uint8_t uStack_44;
  uint8_t uStack_43;
  uint8_t uStack_42;
  uint8_t uStack_41;
  uint8_t uStack_40;
  uint8_t uStack_3f;
  uint8_t uStack_3e;
  uint8_t uStack_3d;
  uint8_t uStack_3c;
  uint8_t uStack_3b;
  uint8_t uStack_3a;
  uint8_t uStack_39;
  
  if (caller_locked == 0) {
    pthread_mutex_lock((pthread_mutex_t *)&logctx.mutex);
  }
  if ((conn->state).generation != ptls_log._generation) {
    uVar9 = 0;
    if (get_sni == (_func_char_ptr_void_ptr *)0x0) {
      search_for = (char *)0x0;
    }
    else {
      search_for = (*get_sni)(get_sni_arg);
    }
    uVar5 = _SHA384_Update;
    uVar4 = _in6addr_any;
    lVar8 = 0;
    do {
      if (((logctx.conns[lVar8].points != (char *)0x0) &&
          (fVar1 = logctx.conns[lVar8].sample_ratio,
          conn->random_ <= fVar1 && fVar1 != conn->random_)) &&
         (iVar6 = is_in_stringlist(logctx.conns[lVar8].snis,search_for), iVar6 != 0)) {
        paVar3 = &(logctx.conns[lVar8].addresses)->__in6_u;
        local_48 = (uint8_t)uVar4;
        uStack_47 = (uint8_t)((ulong)uVar4 >> 8);
        uStack_46 = (uint8_t)((ulong)uVar4 >> 0x10);
        uStack_45 = (uint8_t)((ulong)uVar4 >> 0x18);
        uStack_44 = (uint8_t)((ulong)uVar4 >> 0x20);
        uStack_43 = (uint8_t)((ulong)uVar4 >> 0x28);
        uStack_42 = (uint8_t)((ulong)uVar4 >> 0x30);
        uStack_41 = (uint8_t)((ulong)uVar4 >> 0x38);
        uStack_40 = (uint8_t)uVar5;
        uStack_3f = (uint8_t)((ulong)uVar5 >> 8);
        uStack_3e = (uint8_t)((ulong)uVar5 >> 0x10);
        uStack_3d = (uint8_t)((ulong)uVar5 >> 0x18);
        uStack_3c = (uint8_t)((ulong)uVar5 >> 0x20);
        uStack_3b = (uint8_t)((ulong)uVar5 >> 0x28);
        uStack_3a = (uint8_t)((ulong)uVar5 >> 0x30);
        uStack_39 = (uint8_t)((ulong)uVar5 >> 0x38);
        auVar11[0] = -(paVar3->__u6_addr8[0] == local_48);
        auVar11[1] = -(*(undefined1 *)((long)paVar3 + 1) == uStack_47);
        auVar11[2] = -(*(undefined1 *)((long)paVar3 + 2) == uStack_46);
        auVar11[3] = -(*(undefined1 *)((long)paVar3 + 3) == uStack_45);
        auVar11[4] = -(*(undefined1 *)((long)paVar3 + 4) == uStack_44);
        auVar11[5] = -(*(undefined1 *)((long)paVar3 + 5) == uStack_43);
        auVar11[6] = -(*(undefined1 *)((long)paVar3 + 6) == uStack_42);
        auVar11[7] = -(*(undefined1 *)((long)paVar3 + 7) == uStack_41);
        auVar11[8] = -(*(undefined1 *)((long)paVar3 + 8) == uStack_40);
        auVar11[9] = -(*(undefined1 *)((long)paVar3 + 9) == uStack_3f);
        auVar11[10] = -(*(undefined1 *)((long)paVar3 + 10) == uStack_3e);
        auVar11[0xb] = -(*(undefined1 *)((long)paVar3 + 0xb) == uStack_3d);
        auVar11[0xc] = -(*(undefined1 *)((long)paVar3 + 0xc) == uStack_3c);
        auVar11[0xd] = -(*(undefined1 *)((long)paVar3 + 0xd) == uStack_3b);
        auVar11[0xe] = -(*(undefined1 *)((long)paVar3 + 0xe) == uStack_3a);
        auVar11[0xf] = -(*(undefined1 *)((long)paVar3 + 0xf) == uStack_39);
        if ((ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe |
                    (ushort)(auVar11[0xf] >> 7) << 0xf) != 0xffff) {
          auVar12[0] = -((conn->address).__in6_u.__u6_addr8[0] == local_48);
          auVar12[1] = -((conn->address).__in6_u.__u6_addr8[1] == uStack_47);
          auVar12[2] = -((conn->address).__in6_u.__u6_addr8[2] == uStack_46);
          auVar12[3] = -((conn->address).__in6_u.__u6_addr8[3] == uStack_45);
          auVar12[4] = -((conn->address).__in6_u.__u6_addr8[4] == uStack_44);
          auVar12[5] = -((conn->address).__in6_u.__u6_addr8[5] == uStack_43);
          auVar12[6] = -((conn->address).__in6_u.__u6_addr8[6] == uStack_42);
          auVar12[7] = -((conn->address).__in6_u.__u6_addr8[7] == uStack_41);
          auVar12[8] = -((conn->address).__in6_u.__u6_addr8[8] == uStack_40);
          auVar12[9] = -((conn->address).__in6_u.__u6_addr8[9] == uStack_3f);
          auVar12[10] = -((conn->address).__in6_u.__u6_addr8[10] == uStack_3e);
          auVar12[0xb] = -((conn->address).__in6_u.__u6_addr8[0xb] == uStack_3d);
          auVar12[0xc] = -((conn->address).__in6_u.__u6_addr8[0xc] == uStack_3c);
          auVar12[0xd] = -((conn->address).__in6_u.__u6_addr8[0xd] == uStack_3b);
          auVar12[0xe] = -((conn->address).__in6_u.__u6_addr8[0xe] == uStack_3a);
          auVar12[0xf] = -((conn->address).__in6_u.__u6_addr8[0xf] == uStack_39);
          if ((ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe |
                      (ushort)(auVar12[0xf] >> 7) << 0xf) == 0xffff) goto LAB_001202cf;
          iVar2.__in6_u = *(anon_union_16_3_a3f0114d_for___in6_u *)paVar3->__u6_addr8;
          auVar14[0] = -((conn->address).__in6_u.__u6_addr8[0] == iVar2.__in6_u._0_1_);
          auVar14[1] = -((conn->address).__in6_u.__u6_addr8[1] == iVar2.__in6_u._1_1_);
          auVar14[2] = -((conn->address).__in6_u.__u6_addr8[2] == iVar2.__in6_u._2_1_);
          auVar14[3] = -((conn->address).__in6_u.__u6_addr8[3] == iVar2.__in6_u._3_1_);
          auVar14[4] = -((conn->address).__in6_u.__u6_addr8[4] == iVar2.__in6_u._4_1_);
          auVar14[5] = -((conn->address).__in6_u.__u6_addr8[5] == iVar2.__in6_u._5_1_);
          auVar14[6] = -((conn->address).__in6_u.__u6_addr8[6] == iVar2.__in6_u._6_1_);
          auVar14[7] = -((conn->address).__in6_u.__u6_addr8[7] == iVar2.__in6_u._7_1_);
          auVar14[8] = -((conn->address).__in6_u.__u6_addr8[8] == iVar2.__in6_u._8_1_);
          auVar14[9] = -((conn->address).__in6_u.__u6_addr8[9] == iVar2.__in6_u._9_1_);
          auVar14[10] = -((conn->address).__in6_u.__u6_addr8[10] == iVar2.__in6_u._10_1_);
          auVar14[0xb] = -((conn->address).__in6_u.__u6_addr8[0xb] == iVar2.__in6_u._11_1_);
          auVar14[0xc] = -((conn->address).__in6_u.__u6_addr8[0xc] == iVar2.__in6_u._12_1_);
          auVar14[0xd] = -((conn->address).__in6_u.__u6_addr8[0xd] == iVar2.__in6_u._13_1_);
          auVar14[0xe] = -((conn->address).__in6_u.__u6_addr8[0xe] == iVar2.__in6_u._14_1_);
          auVar14[0xf] = -((conn->address).__in6_u.__u6_addr8[0xf] == iVar2.__in6_u._15_1_);
          if ((ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe |
                      (ushort)(auVar14[0xf] >> 7) << 0xf) != 0xffff) {
            do {
              paVar7 = paVar3 + 1;
              auVar13[0] = -(paVar7->__u6_addr8[0] == local_48);
              auVar13[1] = -(*(undefined1 *)((long)(paVar3 + 1) + 1) == uStack_47);
              auVar13[2] = -(*(undefined1 *)((long)(paVar3 + 1) + 2) == uStack_46);
              auVar13[3] = -(*(undefined1 *)((long)(paVar3 + 1) + 3) == uStack_45);
              auVar13[4] = -(*(undefined1 *)((long)(paVar3 + 1) + 4) == uStack_44);
              auVar13[5] = -(*(undefined1 *)((long)(paVar3 + 1) + 5) == uStack_43);
              auVar13[6] = -(*(undefined1 *)((long)(paVar3 + 1) + 6) == uStack_42);
              auVar13[7] = -(*(undefined1 *)((long)(paVar3 + 1) + 7) == uStack_41);
              auVar13[8] = -(*(undefined1 *)((long)(paVar3 + 1) + 8) == uStack_40);
              auVar13[9] = -(*(undefined1 *)((long)(paVar3 + 1) + 9) == uStack_3f);
              auVar13[10] = -(*(undefined1 *)((long)(paVar3 + 1) + 10) == uStack_3e);
              auVar13[0xb] = -(*(undefined1 *)((long)(paVar3 + 1) + 0xb) == uStack_3d);
              auVar13[0xc] = -(*(undefined1 *)((long)(paVar3 + 1) + 0xc) == uStack_3c);
              auVar13[0xd] = -(*(undefined1 *)((long)(paVar3 + 1) + 0xd) == uStack_3b);
              auVar13[0xe] = -(*(undefined1 *)((long)(paVar3 + 1) + 0xe) == uStack_3a);
              auVar13[0xf] = -(*(undefined1 *)((long)(paVar3 + 1) + 0xf) == uStack_39);
              bVar10 = (ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe |
                               (ushort)(auVar13[0xf] >> 7) << 0xf) == 0xffff;
              if (bVar10) goto LAB_001202cf;
              auVar11 = *(undefined1 (*) [16])paVar7->__u6_addr8;
              auVar15[0] = -((conn->address).__in6_u.__u6_addr8[0] == auVar11[0]);
              auVar15[1] = -((conn->address).__in6_u.__u6_addr8[1] == auVar11[1]);
              auVar15[2] = -((conn->address).__in6_u.__u6_addr8[2] == auVar11[2]);
              auVar15[3] = -((conn->address).__in6_u.__u6_addr8[3] == auVar11[3]);
              auVar15[4] = -((conn->address).__in6_u.__u6_addr8[4] == auVar11[4]);
              auVar15[5] = -((conn->address).__in6_u.__u6_addr8[5] == auVar11[5]);
              auVar15[6] = -((conn->address).__in6_u.__u6_addr8[6] == auVar11[6]);
              auVar15[7] = -((conn->address).__in6_u.__u6_addr8[7] == auVar11[7]);
              auVar15[8] = -((conn->address).__in6_u.__u6_addr8[8] == auVar11[8]);
              auVar15[9] = -((conn->address).__in6_u.__u6_addr8[9] == auVar11[9]);
              auVar15[10] = -((conn->address).__in6_u.__u6_addr8[10] == auVar11[10]);
              auVar15[0xb] = -((conn->address).__in6_u.__u6_addr8[0xb] == auVar11[0xb]);
              auVar15[0xc] = -((conn->address).__in6_u.__u6_addr8[0xc] == auVar11[0xc]);
              auVar15[0xd] = -((conn->address).__in6_u.__u6_addr8[0xd] == auVar11[0xd]);
              auVar15[0xe] = -((conn->address).__in6_u.__u6_addr8[0xe] == auVar11[0xe]);
              auVar15[0xf] = -((conn->address).__in6_u.__u6_addr8[0xf] == auVar11[0xf]);
              paVar3 = paVar7;
            } while ((ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                              (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe |
                             (ushort)(auVar15[0xf] >> 7) << 0xf) != 0xffff);
            if (bVar10) goto LAB_001202cf;
          }
        }
        uVar9 = uVar9 | 1 << ((uint)lVar8 & 0x1f);
      }
LAB_001202cf:
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0x20);
    (conn->state).active_conns = uVar9;
    (conn->state).generation = ptls_log._generation;
  }
  if (caller_locked == 0) {
    pthread_mutex_unlock((pthread_mutex_t *)&logctx.mutex);
    return;
  }
  return;
}

Assistant:

void ptls_log__recalc_conn(int caller_locked, struct st_ptls_log_conn_state_t *conn, const char *(*get_sni)(void *),
                           void *get_sni_arg)
{
    if (!caller_locked)
        pthread_mutex_lock(&logctx.mutex);

    if (conn->state.generation != ptls_log._generation) {
        /* update active bitmap */
        uint32_t new_active = 0;
        const char *sni = get_sni != NULL ? get_sni(get_sni_arg) : NULL;
        for (size_t slot = 0; slot < PTLS_ELEMENTSOF(logctx.conns); ++slot) {
            if (logctx.conns[slot].points != NULL && conn->random_ < logctx.conns[slot].sample_ratio &&
                is_in_stringlist(logctx.conns[slot].snis, sni) && is_in_addresslist(logctx.conns[slot].addresses, &conn->address)) {
                new_active |= (uint32_t)1 << slot;
            }
        }
        conn->state.active_conns = new_active;
        conn->state.generation = ptls_log._generation;
    }

    if (!caller_locked)
        pthread_mutex_unlock(&logctx.mutex);
}